

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrecursive_maximum_likelihood_parameter_generation.cc
# Opt level: O0

bool __thiscall
sptk::NonrecursiveMaximumLikelihoodParameterGeneration::Run
          (NonrecursiveMaximumLikelihoodParameterGeneration *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *mean_vectors,
          vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *covariance_matrices
          ,vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *smoothed_static_parameters)

{
  SymmetricMatrix *pSVar1;
  double dVar2;
  double dVar3;
  _Bit_iterator __last;
  _Bit_iterator __first;
  bool bVar4;
  size_type sVar5;
  size_type sVar6;
  const_reference pvVar7;
  const_reference pvVar8;
  difference_type dVar9;
  reference pvVar10;
  reference pvVar11;
  double *pdVar12;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_RCX;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *in_RDX;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_RSI;
  long in_RDI;
  double dVar13;
  reference rVar14;
  iterator iVar15;
  int k_3;
  int k_2;
  double *C;
  int absolute_t_2;
  int u_1;
  double *c_2;
  int i_3;
  int t_5;
  double *c_1;
  double *g_1;
  int i_2;
  int t_4;
  double *g;
  double *r;
  int j_2;
  int i_1;
  double z;
  int i;
  int t_3;
  int index;
  int k_1;
  double *window_coefficients2;
  int half_window_width2;
  double u;
  int c;
  double wu;
  int biased_t_1;
  int j_1;
  double *window_coefficients_1;
  int half_window_width_1;
  int d_1;
  int n;
  int tau;
  int m;
  int t_2;
  double q;
  int l;
  double p;
  double *window_coefficients;
  int biased_absolute_t;
  int biased_t;
  int j;
  int half_window_width;
  int d;
  bool is_boundary;
  int k;
  double *mean;
  SymmetricMatrix precision;
  int t_1;
  int absolute_t_1;
  int t;
  vector<double,_std::allocator<double>_> cc;
  vector<double,_std::allocator<double>_> gg;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  wuw;
  vector<double,_std::allocator<double>_> wum;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> vseq;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  mseq;
  int wuw_width;
  int wuw_height;
  int max_window_width;
  int continuous_length;
  int absolute_t;
  vector<bool,_std::allocator<bool>_> is_continuous;
  int sequence_length;
  int length;
  int static_size;
  int num_window;
  int in_stack_fffffffffffff9cc;
  SymmetricMatrix *in_stack_fffffffffffff9d0;
  SymmetricMatrix *in_stack_fffffffffffff9d8;
  undefined7 in_stack_fffffffffffff9e0;
  undefined1 in_stack_fffffffffffff9e7;
  value_type in_stack_fffffffffffff9e8;
  undefined7 in_stack_fffffffffffff9f0;
  undefined1 in_stack_fffffffffffff9f7;
  _Bit_type *in_stack_fffffffffffff9f8;
  undefined8 in_stack_fffffffffffffa00;
  value_type vVar16;
  undefined4 in_stack_fffffffffffffa08;
  int in_stack_fffffffffffffa0c;
  SymmetricMatrix *in_stack_fffffffffffffa10;
  SymmetricMatrix *in_stack_fffffffffffffaf0;
  SymmetricMatrix *in_stack_fffffffffffffaf8;
  byte local_4eb;
  byte local_4ea;
  int local_410;
  int local_40c;
  reference local_408;
  reference local_3f8;
  int local_3f0;
  int local_3ec;
  reference local_3e8;
  int local_3e0;
  int local_3dc;
  reference local_3d8;
  reference local_3d0;
  int local_3c8;
  int local_3c4;
  reference local_3c0;
  reference local_3b8;
  int local_3b0;
  int local_3ac;
  double local_3a8;
  int local_3a0;
  int local_39c;
  int local_398;
  int local_394;
  const_reference local_390;
  int local_384;
  Row local_380;
  double local_368;
  int local_35c;
  double local_358;
  int local_350;
  int local_34c;
  double *local_348;
  int local_340;
  int local_33c;
  int local_338;
  int local_334;
  int local_330;
  int local_32c;
  Row local_328;
  Row local_310;
  double local_2f8;
  int local_2ec;
  Row local_2e8;
  Row local_2d0;
  SymmetricMatrix *local_2b8;
  reference local_2b0;
  const_reference local_2a0;
  int local_294;
  int local_290;
  int local_28c;
  int local_288;
  int local_284;
  byte local_27d;
  int local_27c;
  const_reference local_278;
  int local_26c;
  reference local_228;
  int local_218;
  int local_214;
  int local_210;
  vector<double,_std::allocator<double>_> local_208;
  vector<double,_std::allocator<double>_> local_1e8 [2];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_1b0;
  vector<double,_std::allocator<double>_> local_190 [4];
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> local_130 [2];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_f8;
  int local_e0;
  int local_dc;
  int local_d8;
  undefined1 local_d1;
  _Bit_type *local_d0;
  uint local_c8;
  _Bit_type *local_c0;
  uint local_b8;
  _Bit_type *local_b0;
  uint local_a8;
  _Bit_type *local_a0;
  uint local_98;
  int local_8c;
  reference local_88;
  int local_78;
  undefined1 local_61;
  vector<bool,_std::allocator<bool>_> local_60;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_28;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *local_20;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_18;
  byte local_1;
  
  if (((*(byte *)(in_RDI + 0x38) & 1) != 0) &&
     (local_28 = in_RCX, local_20 = in_RDX, local_18 = in_RSI,
     bVar4 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::empty((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0)), !bVar4)) {
    sVar5 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(local_18);
    sVar6 = std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::size
                      (local_20);
    if ((sVar5 == sVar6) &&
       (local_28 !=
        (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         *)0x0)) {
      sVar5 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)(in_RDI + 0x10));
      local_2c = (int)sVar5;
      local_30 = *(int *)(in_RDI + 8) + 1;
      local_34 = local_30 * local_2c;
      bVar4 = anon_unknown.dwarf_ef6b::CheckSize
                        ((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          *)in_stack_fffffffffffff9d8,
                         (int)((ulong)in_stack_fffffffffffff9d0 >> 0x20));
      if ((bVar4) &&
         (bVar4 = anon_unknown.dwarf_ef6b::CheckSize
                            ((vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                              *)in_stack_fffffffffffff9d8,
                             (int)((ulong)in_stack_fffffffffffff9d0 >> 0x20)), bVar4)) {
        sVar5 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::size(local_18);
        local_38 = (int)sVar5;
        local_61 = 1;
        std::allocator<bool>::allocator((allocator<bool> *)0x10b73f);
        std::vector<bool,_std::allocator<bool>_>::vector
                  ((vector<bool,_std::allocator<bool>_> *)
                   CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                   (size_type)in_stack_fffffffffffff9e8,
                   (bool *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
                   (allocator_type *)in_stack_fffffffffffff9d8);
        std::allocator<bool>::~allocator((allocator<bool> *)0x10b773);
        if ((*(byte *)(in_RDI + 0x28) & 1) != 0) {
          for (local_78 = 0; local_78 < local_38; local_78 = local_78 + 1) {
            dVar13 = *(double *)(in_RDI + 0x30);
            pvVar7 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](local_18,(long)local_78);
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar7,0);
            if ((dVar13 == *pvVar8) && (!NAN(dVar13) && !NAN(*pvVar8))) {
              rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 ((vector<bool,_std::allocator<bool>_> *)
                                  CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                                  (size_type)in_stack_fffffffffffff9e8);
              local_88 = rVar14;
              std::_Bit_reference::operator=(&local_88,false);
            }
          }
        }
        iVar15 = std::vector<bool,_std::allocator<bool>_>::begin
                           ((vector<bool,_std::allocator<bool>_> *)0x10b8ba);
        local_b0 = iVar15.super__Bit_iterator_base._M_p;
        local_a8 = iVar15.super__Bit_iterator_base._M_offset;
        local_a0 = local_b0;
        local_98 = local_a8;
        iVar15 = std::vector<bool,_std::allocator<bool>_>::end(&local_60);
        local_d0 = iVar15.super__Bit_iterator_base._M_p;
        local_c8 = iVar15.super__Bit_iterator_base._M_offset;
        local_d1 = 1;
        __first.super__Bit_iterator_base._M_p._4_4_ = in_stack_fffffffffffffa0c;
        __first.super__Bit_iterator_base._M_p._0_4_ = in_stack_fffffffffffffa08;
        __first.super__Bit_iterator_base._8_8_ = in_stack_fffffffffffffa10;
        __last.super__Bit_iterator_base._8_8_ = in_stack_fffffffffffffa00;
        __last.super__Bit_iterator_base._M_p = in_stack_fffffffffffff9f8;
        local_c0 = local_d0;
        local_b8 = local_c8;
        dVar9 = std::count<std::_Bit_iterator,bool>
                          (__first,__last,
                           (bool *)CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0));
        local_8c = (int)dVar9;
        local_d8 = *(int *)(in_RDI + 0x3c) * 2 + 1;
        local_dc = local_30 * local_8c;
        local_e0 = local_30 * local_d8;
        std::allocator<double>::allocator((allocator<double> *)0x10b9ea);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                   (size_type)in_stack_fffffffffffff9e8,
                   (allocator_type *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
        std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
                  ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x10ba1e);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                 (size_type)in_stack_fffffffffffff9e8,
                 (value_type *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
                 (allocator_type *)in_stack_fffffffffffff9d8);
        std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
                  ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x10ba52);
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
        std::allocator<double>::~allocator((allocator<double> *)0x10ba6c);
        SymmetricMatrix::SymmetricMatrix(in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c);
        std::allocator<sptk::SymmetricMatrix>::allocator
                  ((allocator<sptk::SymmetricMatrix> *)0x10baa7);
        std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::vector
                  ((vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
                   CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                   (size_type)in_stack_fffffffffffff9e8,
                   (value_type *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
                   (allocator_type *)in_stack_fffffffffffff9d8);
        std::allocator<sptk::SymmetricMatrix>::~allocator
                  ((allocator<sptk::SymmetricMatrix> *)0x10badb);
        SymmetricMatrix::~SymmetricMatrix(in_stack_fffffffffffff9d0);
        std::allocator<double>::allocator((allocator<double> *)0x10bb0d);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                   (size_type)in_stack_fffffffffffff9e8,
                   (allocator_type *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
        std::allocator<double>::~allocator((allocator<double> *)0x10bb39);
        std::allocator<double>::allocator((allocator<double> *)0x10bb6e);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                   (size_type)in_stack_fffffffffffff9e8,
                   (allocator_type *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
        std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
                  ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x10bba2);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                 (size_type)in_stack_fffffffffffff9e8,
                 (value_type *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
                 (allocator_type *)in_stack_fffffffffffff9d8);
        std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
                  ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x10bbd6);
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
        std::allocator<double>::~allocator((allocator<double> *)0x10bbf0);
        std::allocator<double>::allocator((allocator<double> *)0x10bc15);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                   (size_type)in_stack_fffffffffffff9e8,
                   (allocator_type *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
        std::allocator<double>::~allocator((allocator<double> *)0x10bc41);
        std::allocator<double>::allocator((allocator<double> *)0x10bc66);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                   (size_type)in_stack_fffffffffffff9e8,
                   (allocator_type *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
        std::allocator<double>::~allocator((allocator<double> *)0x10bc92);
        sVar5 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::size(local_28);
        if (sVar5 != (long)local_38) {
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                   (size_type)in_stack_fffffffffffff9e8);
        }
        local_210 = 0;
        while( true ) {
          if (local_38 <= local_210) break;
          pvVar10 = std::
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ::operator[](local_28,(long)local_210);
          sVar5 = std::vector<double,_std::allocator<double>_>::size(pvVar10);
          if (sVar5 != (long)local_30) {
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::operator[](local_28,(long)local_210);
            std::vector<double,_std::allocator<double>_>::resize
                      ((vector<double,_std::allocator<double>_> *)
                       CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                       (size_type)in_stack_fffffffffffff9e8);
          }
          local_210 = local_210 + 1;
        }
        local_218 = 0;
        for (local_214 = 0; local_214 < local_38; local_214 = local_214 + 1) {
          rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)
                              CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                              (size_type)in_stack_fffffffffffff9e8);
          local_228 = rVar14;
          bVar4 = std::_Bit_reference::operator_cast_to_bool(&local_228);
          if (((bVar4 ^ 0xffU) & 1) == 0) {
            SymmetricMatrix::SymmetricMatrix(in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c);
            std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::operator[]
                      (local_20,(long)local_214);
            bVar4 = SymmetricMatrix::Invert(in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
            if (bVar4) {
              pvVar7 = std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::operator[](local_18,(long)local_214);
              local_278 = std::vector<double,_std::allocator<double>_>::operator[](pvVar7,0);
              for (local_27c = 0; local_27c < local_34; local_27c = local_27c + 1) {
                local_27d = 0;
                local_284 = local_27c / local_30;
                pvVar7 = std::
                         vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                       *)(in_RDI + 0x10),(long)local_284);
                sVar5 = std::vector<double,_std::allocator<double>_>::size(pvVar7);
                local_288 = ((int)sVar5 + -1) / 2;
                for (local_28c = -local_288; local_28c <= local_288; local_28c = local_28c + 1) {
                  local_290 = local_218 + local_28c;
                  local_294 = local_214 + local_28c;
                  pvVar7 = std::
                           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                         *)(in_RDI + 0x10),(long)local_284);
                  local_2a0 = std::vector<double,_std::allocator<double>_>::operator[]
                                        (pvVar7,(long)local_288);
                  local_4ea = 1;
                  if ((-1 < local_290) && (local_4ea = 1, local_290 < local_8c)) {
                    local_4eb = 0;
                    if (((local_2a0[local_28c] != 0.0) || (NAN(local_2a0[local_28c]))) &&
                       ((local_4eb = 0, -1 < local_294 && (local_4eb = 0, local_294 < local_38)))) {
                      rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                         ((vector<bool,_std::allocator<bool>_> *)
                                          CONCAT17(in_stack_fffffffffffff9f7,
                                                   in_stack_fffffffffffff9f0),
                                          (size_type)in_stack_fffffffffffff9e8);
                      local_2b0 = rVar14;
                      bVar4 = std::_Bit_reference::operator_cast_to_bool(&local_2b0);
                      local_4eb = bVar4 ^ 0xff;
                    }
                    local_4ea = local_4eb;
                  }
                  if ((local_4ea & 1) != 0) {
                    local_27d = 1;
                  }
                }
                if ((local_27d & 1) == 0) {
                  SymmetricMatrix::operator[]
                            (in_stack_fffffffffffff9d8,
                             (int)((ulong)in_stack_fffffffffffff9d0 >> 0x20));
                  in_stack_fffffffffffffaf8 =
                       (SymmetricMatrix *)
                       SymmetricMatrix::Row::operator[]
                                 ((Row *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
                  pSVar1 = (SymmetricMatrix *)in_stack_fffffffffffffaf8->_vptr_SymmetricMatrix;
                  SymmetricMatrix::Row::~Row(&local_2d0);
                  dVar13 = local_278[local_27c];
                  local_2b8 = pSVar1;
                  pvVar10 = std::
                            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ::operator[](&local_f8,(long)local_218);
                  pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                      (pvVar10,(long)local_27c);
                  *pvVar11 = (double)pSVar1 * dVar13;
                  in_stack_fffffffffffffaf0 = local_2b8;
                  std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::
                  operator[](local_130,(long)local_218);
                  SymmetricMatrix::operator[]
                            (in_stack_fffffffffffff9d8,
                             (int)((ulong)in_stack_fffffffffffff9d0 >> 0x20));
                  pdVar12 = SymmetricMatrix::Row::operator[]
                                      ((Row *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
                  *pdVar12 = (double)in_stack_fffffffffffffaf0;
                  SymmetricMatrix::Row::~Row(&local_2e8);
                  for (local_2ec = 0; local_2ec < local_27c; local_2ec = local_2ec + 1) {
                    SymmetricMatrix::operator[]
                              (in_stack_fffffffffffff9d8,
                               (int)((ulong)in_stack_fffffffffffff9d0 >> 0x20));
                    pdVar12 = SymmetricMatrix::Row::operator[]
                                        ((Row *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc)
                    ;
                    dVar13 = *pdVar12;
                    SymmetricMatrix::Row::~Row(&local_310);
                    local_2f8 = dVar13;
                    if ((dVar13 != 0.0) || (NAN(dVar13))) {
                      dVar2 = local_278[local_2ec];
                      pvVar10 = std::
                                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ::operator[](&local_f8,(long)local_218);
                      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                          (pvVar10,(long)local_27c);
                      dVar3 = local_2f8;
                      *pvVar11 = dVar13 * dVar2 + *pvVar11;
                      dVar13 = local_278[local_27c];
                      pvVar10 = std::
                                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ::operator[](&local_f8,(long)local_218);
                      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                          (pvVar10,(long)local_2ec);
                      dVar2 = local_2f8;
                      *pvVar11 = dVar3 * dVar13 + *pvVar11;
                      std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::
                      operator[](local_130,(long)local_218);
                      SymmetricMatrix::operator[]
                                (in_stack_fffffffffffff9d8,
                                 (int)((ulong)in_stack_fffffffffffff9d0 >> 0x20));
                      pdVar12 = SymmetricMatrix::Row::operator[]
                                          ((Row *)in_stack_fffffffffffff9d0,
                                           in_stack_fffffffffffff9cc);
                      *pdVar12 = dVar2;
                      SymmetricMatrix::Row::~Row(&local_328);
                    }
                  }
                }
              }
              local_218 = local_218 + 1;
              local_26c = 0;
            }
            else {
              local_1 = 0;
              local_26c = 1;
            }
            SymmetricMatrix::~SymmetricMatrix(in_stack_fffffffffffff9d0);
            if (local_26c != 0) goto LAB_0010d54a;
          }
        }
        for (local_32c = 0; local_32c < local_8c; local_32c = local_32c + 1) {
          for (local_330 = 0; local_330 < local_30; local_330 = local_330 + 1) {
            local_334 = local_30 * local_32c + local_330;
            for (local_338 = 0; local_338 < local_30; local_338 = local_338 + 1) {
              for (local_33c = 0; local_33c < local_2c; local_33c = local_33c + 1) {
                pvVar7 = std::
                         vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                       *)(in_RDI + 0x10),(long)local_33c);
                sVar5 = std::vector<double,_std::allocator<double>_>::size(pvVar7);
                local_340 = ((int)sVar5 + -1) / 2;
                pvVar7 = std::
                         vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                       *)(in_RDI + 0x10),(long)local_33c);
                local_348 = std::vector<double,_std::allocator<double>_>::operator[]
                                      (pvVar7,(long)local_340);
                for (local_34c = -*(int *)(in_RDI + 0x3c); local_34c <= *(int *)(in_RDI + 0x3c);
                    local_34c = local_34c + 1) {
                  local_350 = local_32c + local_34c;
                  if ((-1 < local_350) && (local_350 < local_8c)) {
                    if (local_338 == 0) {
                      bVar4 = anon_unknown.dwarf_ef6b::CheckRange
                                        (local_34c,local_340,local_348,true);
                      if (bVar4) {
                        dVar13 = local_348[-local_34c];
                        pvVar10 = std::
                                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  ::operator[](&local_f8,(long)local_350);
                        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                            (pvVar10,(long)(local_33c * local_30 + local_330));
                        dVar2 = *pvVar11;
                        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                            (local_190,(long)local_334);
                        *pvVar11 = dVar13 * dVar2 + *pvVar11;
                      }
                    }
                    local_358 = 0.0;
                    for (local_35c = 0; local_35c < local_2c; local_35c = local_35c + 1) {
                      std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::
                      operator[](local_130,(long)local_350);
                      SymmetricMatrix::operator[]
                                (in_stack_fffffffffffff9d8,
                                 (int)((ulong)in_stack_fffffffffffff9d0 >> 0x20));
                      pdVar12 = SymmetricMatrix::Row::operator[]
                                          ((Row *)in_stack_fffffffffffff9d0,
                                           in_stack_fffffffffffff9cc);
                      dVar13 = *pdVar12;
                      SymmetricMatrix::Row::~Row(&local_380);
                      local_368 = dVar13;
                      pvVar7 = std::
                               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                             *)(in_RDI + 0x10),(long)local_35c);
                      sVar5 = std::vector<double,_std::allocator<double>_>::size(pvVar7);
                      local_384 = ((int)sVar5 + -1) - ((int)sVar5 + -1 >> 0x1f) >> 1;
                      pvVar7 = std::
                               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                             *)(in_RDI + 0x10),(long)local_35c);
                      local_390 = std::vector<double,_std::allocator<double>_>::operator[]
                                            (pvVar7,(long)local_384);
                      bVar4 = anon_unknown.dwarf_ef6b::CheckRange
                                        (local_34c,local_384,local_390,true);
                      if ((bVar4) && ((local_368 != 0.0 || (NAN(local_368))))) {
                        local_358 = local_390[-local_34c] * local_368 + local_358;
                      }
                    }
                    if ((local_358 != 0.0) || (NAN(local_358))) {
                      for (local_394 = 0; local_394 < local_d8 && local_32c + local_394 < local_8c;
                          local_394 = local_394 + 1) {
                        local_398 = (local_30 * local_394 + local_338) - local_330;
                        bVar4 = anon_unknown.dwarf_ef6b::CheckRange
                                          (local_394 - local_34c,local_340,local_348,false);
                        dVar13 = local_358;
                        if ((bVar4) && (-1 < local_398)) {
                          dVar2 = local_348[local_394 - local_34c];
                          pvVar10 = std::
                                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ::operator[](&local_1b0,(long)local_334);
                          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                              (pvVar10,(long)local_398);
                          *pvVar11 = dVar13 * dVar2 + *pvVar11;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        for (local_39c = 0; local_39c < local_dc; local_39c = local_39c + 1) {
          for (local_3a0 = 1; local_3a0 < local_e0 && local_3a0 <= local_39c;
              local_3a0 = local_3a0 + 1) {
            pvVar10 = std::
                      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ::operator[](&local_1b0,(long)(local_39c - local_3a0));
            pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                (pvVar10,(long)local_3a0);
            dVar13 = *pvVar11;
            pvVar10 = std::
                      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ::operator[](&local_1b0,(long)(local_39c - local_3a0));
            pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                (pvVar10,(long)local_3a0);
            dVar2 = *pvVar11;
            pvVar10 = std::
                      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ::operator[](&local_1b0,(long)(local_39c - local_3a0));
            pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](pvVar10,0);
            dVar3 = *pvVar11;
            pvVar10 = std::
                      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ::operator[](&local_1b0,(long)local_39c);
            pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](pvVar10,0);
            *pvVar11 = -(dVar13 * dVar2) * dVar3 + *pvVar11;
          }
          pvVar10 = std::
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ::operator[](&local_1b0,(long)local_39c);
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](pvVar10,0);
          local_3a8 = 1.0 / *pvVar11;
          for (local_3ac = 1; local_3ac < local_e0; local_3ac = local_3ac + 1) {
            for (local_3b0 = 1; local_3ac + local_3b0 < local_e0 && local_3b0 <= local_39c;
                local_3b0 = local_3b0 + 1) {
              pvVar10 = std::
                        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ::operator[](&local_1b0,(long)(local_39c - local_3b0));
              pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (pvVar10,(long)local_3b0);
              vVar16 = *pvVar11;
              pvVar10 = std::
                        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ::operator[](&local_1b0,(long)(local_39c - local_3b0));
              pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (pvVar10,(long)(local_3ac + local_3b0));
              dVar13 = vVar16 * *pvVar11;
              pvVar10 = std::
                        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ::operator[](&local_1b0,(long)(local_39c - local_3b0));
              pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](pvVar10,0);
              vVar16 = *pvVar11;
              pvVar10 = std::
                        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ::operator[](&local_1b0,(long)local_39c);
              pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (pvVar10,(long)local_3ac);
              *pvVar11 = -dVar13 * vVar16 + *pvVar11;
            }
            dVar13 = local_3a8;
            pvVar10 = std::
                      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ::operator[](&local_1b0,(long)local_39c);
            pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                (pvVar10,(long)local_3ac);
            *pvVar11 = dVar13 * *pvVar11;
          }
        }
        local_3b8 = std::vector<double,_std::allocator<double>_>::operator[](local_190,0);
        local_3c0 = std::vector<double,_std::allocator<double>_>::operator[](local_1e8,0);
        for (local_3c4 = 0; local_3c4 < local_dc; local_3c4 = local_3c4 + 1) {
          local_3c0[local_3c4] = local_3b8[local_3c4];
          for (local_3c8 = 1;
              in_stack_fffffffffffff9f7 = local_3c8 < local_e0 && local_3c8 <= local_3c4,
              local_3c8 < local_e0 && local_3c8 <= local_3c4; local_3c8 = local_3c8 + 1) {
            pvVar10 = std::
                      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ::operator[](&local_1b0,(long)(local_3c4 - local_3c8));
            pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                (pvVar10,(long)local_3c8);
            local_3c0[local_3c4] =
                 -*pvVar11 * local_3c0[local_3c4 - local_3c8] + local_3c0[local_3c4];
          }
        }
        local_3d0 = std::vector<double,_std::allocator<double>_>::operator[](local_1e8,0);
        local_3d8 = std::vector<double,_std::allocator<double>_>::operator[](&local_208,0);
        local_3dc = local_dc;
        while (local_3dc = local_3dc + -1, -1 < local_3dc) {
          in_stack_fffffffffffff9e8 = local_3d0[local_3dc];
          pvVar10 = std::
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ::operator[](&local_1b0,(long)local_3dc);
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](pvVar10,0);
          local_3d8[local_3dc] = in_stack_fffffffffffff9e8 / *pvVar11;
          for (local_3e0 = 1; bVar4 = local_3dc + local_3e0 < local_dc,
              in_stack_fffffffffffff9e7 = local_3e0 < local_e0 && bVar4,
              local_3e0 < local_e0 && bVar4; local_3e0 = local_3e0 + 1) {
            pvVar10 = std::
                      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ::operator[](&local_1b0,(long)local_3dc);
            pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                (pvVar10,(long)local_3e0);
            local_3d8[local_3dc] =
                 -*pvVar11 * local_3d8[local_3dc + local_3e0] + local_3d8[local_3dc];
          }
        }
        local_3e8 = std::vector<double,_std::allocator<double>_>::operator[](&local_208,0);
        local_3ec = 0;
        for (local_3f0 = 0; local_3f0 < local_38; local_3f0 = local_3f0 + 1) {
          pvVar10 = std::
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ::operator[](local_28,(long)local_3f0);
          local_3f8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar10,0);
          rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)
                              CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                              (size_type)in_stack_fffffffffffff9e8);
          local_408 = rVar14;
          bVar4 = std::_Bit_reference::operator_cast_to_bool(&local_408);
          if (bVar4) {
            for (local_40c = 0; local_40c < local_30; local_40c = local_40c + 1) {
              local_3f8[local_40c] = local_3e8[local_3ec];
              local_3ec = local_3ec + 1;
            }
          }
          else {
            for (local_410 = 0; local_410 < local_30; local_410 = local_410 + 1) {
              local_3f8[local_410] = *(value_type *)(in_RDI + 0x30);
            }
          }
        }
        local_1 = 1;
        local_26c = 1;
LAB_0010d54a:
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
        std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::~vector
                  ((vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
                   CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
        std::vector<bool,_std::allocator<bool>_>::~vector
                  ((vector<bool,_std::allocator<bool>_> *)0x10d5a5);
      }
      else {
        local_1 = 0;
      }
      goto LAB_0010d604;
    }
  }
  local_1 = 0;
LAB_0010d604:
  return (bool)(local_1 & 1);
}

Assistant:

bool NonrecursiveMaximumLikelihoodParameterGeneration::Run(
    const std::vector<std::vector<double> >& mean_vectors,
    const std::vector<SymmetricMatrix>& covariance_matrices,
    std::vector<std::vector<double> >* smoothed_static_parameters) const {
  // Check inputs.
  if (!is_valid_ || mean_vectors.empty() ||
      mean_vectors.size() != covariance_matrices.size() ||
      NULL == smoothed_static_parameters) {
    return false;
  }

  const int num_window(static_cast<int>(window_coefficients_.size()));
  const int static_size(num_order_ + 1);
  const int length(static_size * num_window);
  if (!CheckSize(mean_vectors, length) ||
      !CheckSize(covariance_matrices, length)) {
    return false;
  }

  // Store positions that contain a magic number.
  const int sequence_length(static_cast<int>(mean_vectors.size()));
  std::vector<bool> is_continuous(sequence_length, true);
  if (use_magic_number_) {
    for (int absolute_t(0); absolute_t < sequence_length; ++absolute_t) {
      if (magic_number_ == mean_vectors[absolute_t][0]) {
        is_continuous[absolute_t] = false;
      }
    }
  }
  const int continuous_length(static_cast<int>(
      std::count(is_continuous.begin(), is_continuous.end(), true)));

  // Prepare memories.
  const int max_window_width(2 * max_half_window_width_ + 1);
  const int wuw_height(static_size * continuous_length);
  const int wuw_width(static_size * max_window_width);
  std::vector<std::vector<double> > mseq(continuous_length,
                                         std::vector<double>(length));
  std::vector<SymmetricMatrix> vseq(continuous_length, SymmetricMatrix(length));
  std::vector<double> wum(wuw_height);
  std::vector<std::vector<double> > wuw(wuw_height,
                                        std::vector<double>(wuw_width));
  std::vector<double> gg(wuw_height);
  std::vector<double> cc(wuw_height);
  {
    if (smoothed_static_parameters->size() !=
        static_cast<std::size_t>(sequence_length)) {
      smoothed_static_parameters->resize(sequence_length);
    }
    for (int t(0); t < sequence_length; ++t) {
      if ((*smoothed_static_parameters)[t].size() !=
          static_cast<std::size_t>(static_size)) {
        (*smoothed_static_parameters)[t].resize(static_size);
      }
    }
  }

  // Set mseq and vseq.
  for (int absolute_t(0), t(0); absolute_t < sequence_length; ++absolute_t) {
    if (!is_continuous[absolute_t]) continue;

    SymmetricMatrix precision;
    if (!covariance_matrices[absolute_t].Invert(&precision)) {
      return false;
    }
    const double* mean(&(mean_vectors[absolute_t][0]));

    for (int k(0); k < length; ++k) {
      // Check boundary.
      bool is_boundary(false);
      {
        const int d(k / static_size);
        const int half_window_width(
            (static_cast<int>(window_coefficients_[d].size()) - 1) / 2);
        for (int j(-half_window_width); j <= half_window_width; ++j) {
          const int biased_t(t + j);
          const int biased_absolute_t(absolute_t + j);
          const double* window_coefficients(
              &(window_coefficients_[d][half_window_width]));
          if (biased_t < 0 || continuous_length <= biased_t ||
              (0.0 != window_coefficients[j] && 0 <= biased_absolute_t &&
               biased_absolute_t < sequence_length &&
               !is_continuous[biased_absolute_t])) {
            is_boundary = true;
          }
        }
      }

      if (!is_boundary) {
        const double p(precision[k][k]);
        mseq[t][k] = p * mean[k];
        vseq[t][k][k] = p;
        for (int l(0); l < k; ++l) {
          const double q(precision[k][l]);
          if (0.0 != q) {
            mseq[t][k] += q * mean[l];
            mseq[t][l] += q * mean[k];
            vseq[t][k][l] = q;
          }
        }
      }
    }

    // Update counter.
    ++t;
  }

  // Calculate WUM and WUW.
  for (int t(0); t < continuous_length; ++t) {
    for (int m(0); m < static_size; ++m) {
      const int tau(static_size * t + m);
      for (int n(0); n < static_size; ++n) {
        for (int d(0); d < num_window; ++d) {
          const int half_window_width(
              (static_cast<int>(window_coefficients_[d].size()) - 1) / 2);
          const double* window_coefficients(
              &(window_coefficients_[d][half_window_width]));
          for (int j(-max_half_window_width_); j <= max_half_window_width_;
               ++j) {
            const int biased_t(t + j);
            if (biased_t < 0 || continuous_length <= biased_t) continue;

            // Accumulate W'U^{-1}M.
            if (0 == n &&
                CheckRange(j, half_window_width, window_coefficients, true)) {
              wum[tau] += (window_coefficients[-j] *
                           mseq[biased_t][d * static_size + m]);
            }

            // Accumulate W'U^{-1}W.
            double wu(0.0);
            for (int c(0); c < num_window; ++c) {
              const double u(
                  vseq[biased_t][static_size * c + m][static_size * d + n]);
              const int half_window_width2(
                  (static_cast<int>(window_coefficients_[c].size()) - 1) / 2);
              const double* window_coefficients2(
                  &(window_coefficients_[c][half_window_width2]));
              if (CheckRange(j, half_window_width2, window_coefficients2,
                             true) &&
                  0.0 != u) {
                wu += window_coefficients2[-j] * u;
              }
            }
            if (0.0 != wu) {
              for (int k(0); k < max_window_width && t + k < continuous_length;
                   ++k) {
                const int index(static_size * k + n - m);
                if (CheckRange(k - j, half_window_width, window_coefficients,
                               false) &&
                    0 <= index) {
                  wuw[tau][index] += wu * window_coefficients[k - j];
                }
              }
            }
          }
        }
      }
    }
  }

  // Compute Cholesky factor.
  for (int t(0); t < wuw_height; ++t) {
    for (int i(1); i < wuw_width && i <= t; ++i) {
      wuw[t][0] -= wuw[t - i][i] * wuw[t - i][i] * wuw[t - i][0];
    }

    const double z(1.0 / wuw[t][0]);
    for (int i(1); i < wuw_width; ++i) {
      for (int j(1); i + j < wuw_width && j <= t; ++j) {
        wuw[t][i] -= wuw[t - j][j] * wuw[t - j][i + j] * wuw[t - j][0];
      }
      wuw[t][i] *= z;
    }
  }

  // Forward substitution to solve a set of linear equations.
  {
    const double* r(&(wum[0]));
    double* g(&(gg[0]));
    for (int t(0); t < wuw_height; ++t) {
      g[t] = r[t];
      for (int i(1); i < wuw_width && i <= t; ++i) {
        g[t] -= wuw[t - i][i] * g[t - i];
      }
    }
  }

  // Backward substitution to solve a set of linear equations.
  {
    const double* g(&(gg[0]));
    double* c(&(cc[0]));
    for (int t(wuw_height - 1); 0 <= t; --t) {
      c[t] = g[t] / wuw[t][0];
      for (int i(1); i < wuw_width && t + i < wuw_height; ++i) {
        c[t] -= wuw[t][i] * c[t + i];
      }
    }
  }

  // Store generated parameters.
  {
    const double* c(&(cc[0]));
    int u(0);
    for (int absolute_t(0); absolute_t < sequence_length; ++absolute_t) {
      double* C(&((*smoothed_static_parameters)[absolute_t][0]));
      if (is_continuous[absolute_t]) {
        for (int k(0); k < static_size; ++k) {
          C[k] = c[u++];
        }
      } else {
        for (int k(0); k < static_size; ++k) {
          C[k] = magic_number_;
        }
      }
    }
  }

  return true;
}